

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::TextBasedObject::Dump(TextBasedObject *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_a8 [136];
  
  local_a8[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  DescriptiveObject::Dump(&this->super_DescriptiveObject,stream);
  pcVar1 = UL::EncodeString(&this->PayloadSchemeID,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","PayloadSchemeID",pcVar1);
  pcVar1 = UTF16String::EncodeString(&this->TextMIMEMediaType,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","TextMIMEMediaType",pcVar1);
  pcVar1 = UTF16String::EncodeString(&this->RFC5646TextLanguageCode,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","RFC5646TextLanguageCode",pcVar1);
  if ((this->TextDataDescription).m_has_value == true) {
    pcVar1 = UTF16String::EncodeString(&(this->TextDataDescription).m_property,local_a8,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","TextDataDescription",pcVar1);
  }
  return;
}

Assistant:

void
TextBasedObject::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  DescriptiveObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "PayloadSchemeID", PayloadSchemeID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "TextMIMEMediaType", TextMIMEMediaType.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "RFC5646TextLanguageCode", RFC5646TextLanguageCode.EncodeString(identbuf, IdentBufferLen));
  if ( ! TextDataDescription.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "TextDataDescription", TextDataDescription.get().EncodeString(identbuf, IdentBufferLen));
  }
}